

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textfile.h
# Opt level: O2

bool __thiscall TextFile::readLine(TextFile *this,string *line)

{
  undefined8 in_RAX;
  ssize_t sVar1;
  size_t in_RCX;
  undefined8 uStack_28;
  char ch;
  
  uStack_28 = in_RAX;
  std::__cxx11::string::assign((char *)line);
  do {
    sVar1 = File::read(&this->super_File,(int)&ch,(void *)0x1,in_RCX);
    if ((int)sVar1 != 1) {
      return false;
    }
  } while ((ch == '\n') || (ch == '\r'));
  do {
    std::__cxx11::string::push_back((char)line);
    sVar1 = File::read(&this->super_File,(int)&ch,(void *)0x1,in_RCX);
    if ((int)sVar1 != 1) {
      return line->_M_string_length != 0;
    }
  } while ((ch != '\n') && (ch != '\r'));
  return true;
}

Assistant:

bool readLine(std::string& line) const
    {
        line = "";
        char ch;
        int readCnt;
        do
        {
            readCnt = read(&ch, 1);
        } while (readCnt == 1 && (ch == '\n' || ch == '\r'));
        if (readCnt != 1)
            return false;
        if (ch != '\n' && ch != '\r')
            line += ch;
        while (true)
        {
            readCnt = read(&ch, 1);
            if (readCnt == 1 && ch != '\n' && ch != '\r')
                line += ch;
            else
                break;
        }
        return readCnt == 1 || !line.empty();
    }